

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&>::operator<=
          (result *__return_storage_ptr__,
          expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&> *this,
          char (*rhs) [6])

{
  lest *this_00;
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  size_t __n;
  char (*in_R8) [6];
  ulong uVar4;
  difference_type __diff;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  long local_40 [2];
  
  this_00 = *(lest **)this;
  uVar1 = *(ulong *)this_00;
  sVar3 = strlen(*rhs);
  __n = sVar3;
  if (uVar1 < sVar3) {
    __n = uVar1;
  }
  if (__n != 0) {
    uVar2 = memcmp(*(void **)(this_00 + 8),rhs,__n);
    uVar4 = (ulong)uVar2;
    if (uVar2 != 0) goto LAB_00184d9d;
  }
  uVar4 = 0xffffffff80000000;
  if (-0x80000000 < (long)(uVar1 - sVar3)) {
    uVar4 = uVar1 - sVar3;
  }
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0x7fffffff;
  }
LAB_00184d9d:
  local_50._M_len = (size_t)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<=","");
  to_string<std::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_70,this_00,&local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = (int)uVar4 < 1;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_50._M_len != local_40) {
    operator_delete((void *)local_50._M_len,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }